

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

reference<mpt::array::content> * __thiscall
mpt::reference<mpt::array::content>::operator=
          (reference<mpt::array::content> *this,reference<mpt::array::content> *ref)

{
  long lVar1;
  content *pcVar2;
  content *pcVar3;
  
  pcVar3 = ref->_ref;
  pcVar2 = this->_ref;
  if (pcVar3 != pcVar2) {
    if (pcVar3 == (content *)0x0) {
      pcVar3 = (content *)0x0;
    }
    else {
      lVar1 = (**(code **)(*(long *)pcVar3 + 0x10))(pcVar3);
      if (lVar1 == 0) {
        pcVar3 = (content *)0x0;
      }
      pcVar2 = this->_ref;
    }
    if (pcVar2 != (content *)0x0) {
      (**(code **)(*(long *)pcVar2 + 8))();
    }
    this->_ref = pcVar3;
  }
  return this;
}

Assistant:

inline reference & operator= (reference const &ref)
	{
		T *r = ref._ref;
		if (r == _ref) {
			return *this;
		}
		if (r && !r->addref()) {
			r = 0;
		}
		if (_ref) _ref->unref();
		_ref = r;
		return *this;
	}